

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall HFactor::updatePF(HFactor *this,HVector *aq,HighsInt iRow,HighsInt *hint)

{
  pointer piVar1;
  pointer pdVar2;
  HVector *pHVar3;
  HFactor *pHVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  HighsInt index;
  double value;
  int local_60;
  HighsInt local_5c;
  double local_58;
  HighsInt *local_50;
  HVector *local_48;
  HFactor *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  piVar1 = (aq->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (aq->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = &this->pf_index;
  uVar6 = 0;
  uVar7 = (ulong)(uint)aq->packCount;
  local_5c = iRow;
  local_50 = hint;
  local_48 = aq;
  local_40 = this;
  if (aq->packCount < 1) {
    uVar7 = uVar6;
  }
  for (; pHVar4 = local_40, uVar7 != uVar6; uVar6 = uVar6 + 1) {
    local_60 = piVar1[uVar6];
    local_58 = pdVar2[uVar6];
    if (local_60 != iRow) {
      std::vector<int,_std::allocator<int>_>::push_back(local_38,&local_60);
      std::vector<double,_std::allocator<double>_>::push_back(&this->pf_value,&local_58);
    }
  }
  std::vector<int,_std::allocator<int>_>::push_back(&local_40->pf_pivot_index,&local_5c);
  pHVar3 = local_48;
  std::vector<double,_std::allocator<double>_>::push_back
            (&pHVar4->pf_pivot_value,
             (local_48->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + local_5c);
  local_58 = (double)CONCAT44(local_58._4_4_,
                              (int)((ulong)((long)(pHVar4->pf_index).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(pHVar4->pf_index).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2));
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&pHVar4->pf_start,(int *)&local_58);
  iVar5 = pHVar4->u_total_x + pHVar3->packCount;
  pHVar4->u_total_x = iVar5;
  if (pHVar4->u_merit_x < iVar5) {
    *local_50 = 1;
  }
  return;
}

Assistant:

void HFactor::updatePF(HVector* aq, HighsInt iRow, HighsInt* hint) {
  // Check space
  const HighsInt column_count = aq->packCount;
  const HighsInt* variable_index = aq->packIndex.data();
  const double* columnArray = aq->packValue.data();

  // Copy the pivotal column
  for (HighsInt i = 0; i < column_count; i++) {
    HighsInt index = variable_index[i];
    double value = columnArray[i];
    if (index != iRow) {
      pf_index.push_back(index);
      pf_value.push_back(value);
    }
  }

  // Save pivot
  pf_pivot_index.push_back(iRow);
  pf_pivot_value.push_back(aq->array[iRow]);
  pf_start.push_back(pf_index.size());

  // Check refactor
  u_total_x += aq->packCount;
  if (u_total_x > u_merit_x) *hint = 1;
}